

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O2

void __thiscall TestIpV4::testComparsion(TestIpV4 *this,string *param_1)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  string report;
  allocator local_1d8 [32];
  IpV4 local_1b8 [4];
  IpV4 local_1b4 [4];
  IpV4 local_1b0 [4];
  IpV4 local_1ac [4];
  ostringstream ostr;
  
  if (testComparsion(std::__cxx11::string_const&)::testee == '\0') {
    iVar3 = __cxa_guard_acquire(&testComparsion(std::__cxx11::string_const&)::testee);
    if (iVar3 != 0) {
      std::__cxx11::string::string((string *)&ostr,"192.168.0.1",(allocator *)&report);
      IpV4::IpV4((IpV4 *)&testComparsion(std::__cxx11::string_const&)::testee,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      __cxa_guard_release(&testComparsion(std::__cxx11::string_const&)::testee);
    }
  }
  if (testComparsion(std::__cxx11::string_const&)::localhost == '\0') {
    iVar3 = __cxa_guard_acquire(&testComparsion(std::__cxx11::string_const&)::localhost);
    if (iVar3 != 0) {
      std::__cxx11::string::string((string *)&ostr,"localhost",(allocator *)&report);
      IpV4::IpV4((IpV4 *)&testComparsion(std::__cxx11::string_const&)::localhost,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      __cxa_guard_release(&testComparsion(std::__cxx11::string_const&)::localhost);
    }
  }
  if (testComparsion(std::__cxx11::string_const&)::lower == '\0') {
    iVar3 = __cxa_guard_acquire(&testComparsion(std::__cxx11::string_const&)::lower);
    if (iVar3 != 0) {
      std::__cxx11::string::string((string *)&ostr,"192.167.0.1",(allocator *)&report);
      IpV4::IpV4((IpV4 *)&testComparsion(std::__cxx11::string_const&)::lower,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      __cxa_guard_release(&testComparsion(std::__cxx11::string_const&)::lower);
    }
  }
  if (testComparsion(std::__cxx11::string_const&)::higher == '\0') {
    iVar3 = __cxa_guard_acquire(&testComparsion(std::__cxx11::string_const&)::higher);
    if (iVar3 != 0) {
      std::__cxx11::string::string((string *)&ostr,"193.0.0.0",(allocator *)&report);
      IpV4::IpV4((IpV4 *)&testComparsion(std::__cxx11::string_const&)::higher,(string *)&ostr);
      std::__cxx11::string::~string((string *)&ostr);
      __cxa_guard_release(&testComparsion(std::__cxx11::string_const&)::higher);
    }
  }
  report._M_dataplus._M_p._0_4_ = 0xc0a80001;
  fructose::test_root::get_test_name_abi_cxx11_((string *)&ostr,(test_root *)this);
  fructose::test_root::test_assert_eq<unsigned_int,unsigned_int>
            ((test_root *)this,(uint *)&report,&testComparsion(std::__cxx11::string_const&)::testee,
             (string *)&ostr,"0xC0A80001","testee.value",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd0);
  std::__cxx11::string::~string((string *)&ostr);
  report._M_dataplus._M_p._0_4_ = 0x7f000001;
  fructose::test_root::get_test_name_abi_cxx11_((string *)&ostr,(test_root *)this);
  fructose::test_root::test_assert_eq<unsigned_int,unsigned_int>
            ((test_root *)this,(uint *)&report,
             &testComparsion(std::__cxx11::string_const&)::localhost,(string *)&ostr,"0x7F000001U",
             "localhost.value",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd1);
  std::__cxx11::string::~string((string *)&ostr);
  report._M_dataplus._M_p._0_4_ = 0xc0a70001;
  fructose::test_root::get_test_name_abi_cxx11_((string *)&ostr,(test_root *)this);
  fructose::test_root::test_assert_eq<unsigned_int,unsigned_int>
            ((test_root *)this,(uint *)&report,&testComparsion(std::__cxx11::string_const&)::lower,
             (string *)&ostr,"0xC0A70001","lower.value",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd2);
  std::__cxx11::string::~string((string *)&ostr);
  report._M_dataplus._M_p._0_4_ = 0xc1000000;
  fructose::test_root::get_test_name_abi_cxx11_((string *)&ostr,(test_root *)this);
  fructose::test_root::test_assert_eq<unsigned_int,unsigned_int>
            ((test_root *)this,(uint *)&report,&testComparsion(std::__cxx11::string_const&)::higher,
             (string *)&ostr,"0xC1000000","higher.value",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd3);
  std::__cxx11::string::~string((string *)&ostr);
  (this->super_test_base<TestIpV4>).super_test_root.m_assertion_tested = true;
  paVar1 = &report.field_2;
  report._M_string_length = 0;
  report.field_2._M_local_buf[0] = '\0';
  report._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string((string *)&ostr,"192.168.0.",local_1d8);
  IpV4::IpV4(local_1ac,(string *)&ostr);
  std::__cxx11::string::~string((string *)&ostr);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "expected an exception to be thrown but catchall caught nothing");
  std::endl<char,std::char_traits<char>>(poVar4);
  fructose::test_root::get_test_name_abi_cxx11_((string *)&ostr,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,false,(string *)&ostr,
             "IpV4 {\"192.168.0.\"} throws std::runtime_error",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd4);
  std::__cxx11::string::~string((string *)&ostr);
  std::__cxx11::string::~string((string *)&report);
  (this->super_test_base<TestIpV4>).super_test_root.m_assertion_tested = true;
  report._M_string_length = 0;
  report.field_2._M_local_buf[0] = '\0';
  report._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string((string *)&ostr,"0.0.0.257",local_1d8);
  IpV4::IpV4(local_1b0,(string *)&ostr);
  std::__cxx11::string::~string((string *)&ostr);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "expected an exception to be thrown but catchall caught nothing");
  std::endl<char,std::char_traits<char>>(poVar4);
  fructose::test_root::get_test_name_abi_cxx11_((string *)&ostr,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,false,(string *)&ostr,
             "IpV4 {\"0.0.0.257\"} throws std::runtime_error",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd5);
  std::__cxx11::string::~string((string *)&ostr);
  std::__cxx11::string::~string((string *)&report);
  (this->super_test_base<TestIpV4>).super_test_root.m_assertion_tested = true;
  report._M_string_length = 0;
  report.field_2._M_local_buf[0] = '\0';
  report._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string((string *)&ostr,"-1.0.0.254",local_1d8);
  IpV4::IpV4(local_1b4,(string *)&ostr);
  std::__cxx11::string::~string((string *)&ostr);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "expected an exception to be thrown but catchall caught nothing");
  std::endl<char,std::char_traits<char>>(poVar4);
  fructose::test_root::get_test_name_abi_cxx11_((string *)&ostr,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,false,(string *)&ostr,
             "IpV4 {\"-1.0.0.254\"} throws std::runtime_error",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd6);
  std::__cxx11::string::~string((string *)&ostr);
  std::__cxx11::string::~string((string *)&report);
  (this->super_test_base<TestIpV4>).super_test_root.m_assertion_tested = true;
  report._M_string_length = 0;
  report.field_2._M_local_buf[0] = '\0';
  report._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::string((string *)&ostr,"192.d.0.254",local_1d8);
  IpV4::IpV4(local_1b8,(string *)&ostr);
  std::__cxx11::string::~string((string *)&ostr);
  poVar4 = std::operator<<((ostream *)&std::cout,
                           "expected an exception to be thrown but catchall caught nothing");
  std::endl<char,std::char_traits<char>>(poVar4);
  fructose::test_root::get_test_name_abi_cxx11_((string *)&ostr,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,false,(string *)&ostr,
             "IpV4 {\"192.d.0.254\"} throws std::runtime_error",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd7);
  std::__cxx11::string::~string((string *)&ostr);
  std::__cxx11::string::~string((string *)&report);
  bVar2 = (bool)IpV4::operator<((IpV4 *)&testComparsion(std::__cxx11::string_const&)::lower,
                                (IpV4 *)&testComparsion(std::__cxx11::string_const&)::testee);
  fructose::test_root::get_test_name_abi_cxx11_((string *)&ostr,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar2,(string *)&ostr,"lower < testee",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd8);
  std::__cxx11::string::~string((string *)&ostr);
  bVar2 = (bool)IpV4::operator<((IpV4 *)&testComparsion(std::__cxx11::string_const&)::testee,
                                (IpV4 *)&testComparsion(std::__cxx11::string_const&)::higher);
  fructose::test_root::get_test_name_abi_cxx11_((string *)&ostr,(test_root *)this);
  fructose::test_root::test_assert
            ((test_root *)this,bVar2,(string *)&ostr,"testee < higher",
             "/workspace/llm4binary/github/license_c_cmakelists/Beckhoff[P]ADS/AdsLibTest/main.cpp",
             0xd9);
  std::__cxx11::string::~string((string *)&ostr);
  return;
}

Assistant:

void testComparsion(const std::string&)
    {
        static const IpV4 testee {"192.168.0.1"};
        static const IpV4 localhost {"localhost"};
        static const IpV4 lower {"192.167.0.1"};
        static const IpV4 higher {"193.0.0.0"};

        fructose_assert_eq(0xC0A80001, testee.value);
        fructose_assert_eq(0x7F000001U, localhost.value);
        fructose_assert_eq(0xC0A70001, lower.value);
        fructose_assert_eq(0xC1000000, higher.value);
        fructose_assert_exception(IpV4 {"192.168.0."}, std::runtime_error);     // too short
        fructose_assert_exception(IpV4 {"0.0.0.257"}, std::runtime_error);      // too high
        fructose_assert_exception(IpV4 {"-1.0.0.254"}, std::runtime_error);     // too low
        fructose_assert_exception(IpV4 {"192.d.0.254"}, std::runtime_error);    // invalid
        fructose_assert(lower < testee);
        fructose_assert(testee < higher);
    }